

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterViewInfo::Deserialize(AlterViewInfo *this,Deserializer *deserializer)

{
  AlterViewType AVar1;
  int iVar2;
  SerializationException *this_00;
  string str;
  _Alloc_hider local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,300,"alter_view_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&stack0xffffffffffffffc0,deserializer);
    AVar1 = EnumUtil::FromString<duckdb::AlterViewType>(local_40._M_p);
    if (local_40._M_p != &stack0xffffffffffffffd0) {
      operator_delete(local_40._M_p);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    AVar1 = (AlterViewType)iVar2;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if (AVar1 == RENAME_VIEW) {
    RenameViewInfo::Deserialize((RenameViewInfo *)&stack0xffffffffffffffc0,deserializer);
    (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_40._M_p;
    return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
           (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_40._M_p = &stack0xffffffffffffffd0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffc0,
             "Unsupported type for deserialization of AlterViewInfo!","");
  SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<AlterInfo> AlterViewInfo::Deserialize(Deserializer &deserializer) {
	auto alter_view_type = deserializer.ReadProperty<AlterViewType>(300, "alter_view_type");
	unique_ptr<AlterViewInfo> result;
	switch (alter_view_type) {
	case AlterViewType::RENAME_VIEW:
		result = RenameViewInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterViewInfo!");
	}
	return std::move(result);
}